

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::SuperClassName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Descriptor *descriptor,Options *options)

{
  bool bVar1;
  FileDescriptor *file;
  char *pcVar2;
  allocator local_21;
  Options *local_20;
  Options *options_local;
  Descriptor *descriptor_local;
  
  local_20 = (Options *)descriptor;
  options_local = (Options *)this;
  descriptor_local = (Descriptor *)__return_storage_ptr__;
  file = Descriptor::file((Descriptor *)this);
  bVar1 = HasDescriptorMethods(file,local_20);
  pcVar2 = "::google::protobuf::MessageLite";
  if (bVar1) {
    pcVar2 = "::google::protobuf::Message";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  return __return_storage_ptr__;
}

Assistant:

string SuperClassName(const Descriptor* descriptor, const Options& options) {
  return HasDescriptorMethods(descriptor->file(), options)
             ? "::google::protobuf::Message"
             : "::google::protobuf::MessageLite";
}